

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O0

int anon_unknown.dwarf_11a085c::Strucmp(string_view l,string_view r)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  size_type sVar5;
  int local_6c;
  size_type local_48;
  size_type ri;
  size_type li;
  int rc;
  int lc;
  string_view r_local;
  string_view l_local;
  
  r_local._M_len = (size_t)r._M_str;
  _rc = r._M_len;
  r_local._M_str = (char *)l._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&r_local._M_str);
  if ((bVar1) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&rc), bVar1)) {
    l_local._M_str._4_4_ = 0;
  }
  else {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&r_local._M_str);
    if ((bVar1) ||
       (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&rc), bVar1)) {
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&r_local._M_str);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&rc);
      l_local._M_str._4_4_ = (int)sVar4 - (int)sVar5;
    }
    else {
      ri = 0;
      local_48 = 0;
      do {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&r_local._M_str,ri);
        local_6c = tolower((int)*pvVar3);
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&rc,local_48);
        iVar2 = tolower((int)*pvVar3);
        bVar1 = false;
        if (local_6c == iVar2) {
          sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&r_local._M_str);
          bVar1 = false;
          if (ri + 1 < sVar4) {
            sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)&rc);
            bVar1 = local_48 + 1 < sVar4;
          }
        }
        local_48 = local_48 + 1;
        ri = ri + 1;
      } while (bVar1);
      if (local_6c == iVar2) {
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&r_local._M_str);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&rc);
        local_6c = (int)sVar4 - (int)sVar5;
      }
      else {
        local_6c = local_6c - iVar2;
      }
      l_local._M_str._4_4_ = local_6c;
    }
  }
  return l_local._M_str._4_4_;
}

Assistant:

int Strucmp(cm::string_view l, cm::string_view r)
{
  if (l.empty() && r.empty()) {
    return 0;
  }
  if (l.empty() || r.empty()) {
    return static_cast<int>(l.size() - r.size());
  }

  int lc;
  int rc;
  cm::string_view::size_type li = 0;
  cm::string_view::size_type ri = 0;

  do {
    lc = std::tolower(l[li++]);
    rc = std::tolower(r[ri++]);
  } while (lc == rc && li < l.size() && ri < r.size());

  return lc == rc ? static_cast<int>(l.size() - r.size()) : lc - rc;
}